

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

stCoRoutine_t *
co_create_env(stCoRoutineEnv_t *env,stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg)

{
  stCoRoutine_t *__s;
  stStackMem_t *local_48;
  stStackMem_t *stack_mem;
  stCoRoutine_t *lp;
  undefined4 uStack_30;
  stCoRoutineAttr_t at;
  void *arg_local;
  pfn_co_routine_t pfn_local;
  stCoRoutineAttr_t *attr_local;
  stCoRoutineEnv_t *env_local;
  
  at.share_stack = (stShareStack_t *)arg;
  stCoRoutineAttr_t::stCoRoutineAttr_t((stCoRoutineAttr_t *)((long)&lp + 4));
  if (attr != (stCoRoutineAttr_t *)0x0) {
    lp._4_4_ = (uint)*(undefined8 *)attr;
    uStack_30 = (undefined4)((ulong)*(undefined8 *)attr >> 0x20);
    at.stack_size = *(int *)((long)&attr->share_stack + 4);
  }
  if ((int)lp._4_4_ < 1) {
    lp._4_4_ = 0x20000;
  }
  else if (0x800000 < (int)lp._4_4_) {
    lp._4_4_ = 0x800000;
  }
  if ((lp._4_4_ & 0xfff) != 0) {
    lp._4_4_ = (lp._4_4_ & 0xfffff000) + 0x1000;
  }
  __s = (stCoRoutine_t *)malloc(0x20c8);
  memset(__s,0,0x20c8);
  __s->env = env;
  __s->pfn = pfn;
  __s->arg = at.share_stack;
  if (CONCAT44(at.stack_size,uStack_30) == 0) {
    local_48 = co_alloc_stackmem(lp._4_4_);
  }
  else {
    local_48 = co_get_stackmem((stShareStack_t *)CONCAT44(at.stack_size,uStack_30));
    lp._4_4_ = *(uint *)(CONCAT44(at.stack_size,uStack_30) + 4);
  }
  __s->stack_mem = local_48;
  (__s->ctx).ss_sp = local_48->stack_buffer;
  (__s->ctx).ss_size = (long)(int)lp._4_4_;
  __s->cStart = '\0';
  __s->cEnd = '\0';
  __s->cIsMain = '\0';
  __s->cEnableSysHook = '\0';
  __s->cIsShareStack = CONCAT44(at.stack_size,uStack_30) != 0;
  __s->save_size = 0;
  __s->save_buffer = (char *)0x0;
  return __s;
}

Assistant:

struct stCoRoutine_t *co_create_env( stCoRoutineEnv_t * env, const stCoRoutineAttr_t* attr,
		pfn_co_routine_t pfn,void *arg )
{

	stCoRoutineAttr_t at;
	if( attr )
	{
		memcpy( &at,attr,sizeof(at) );
	}
	if( at.stack_size <= 0 )
	{
		at.stack_size = 128 * 1024;
	}
	else if( at.stack_size > 1024 * 1024 * 8 )
	{
		at.stack_size = 1024 * 1024 * 8;
	}

	if( at.stack_size & 0xFFF ) 
	{
		at.stack_size &= ~0xFFF;
		at.stack_size += 0x1000;
	}

	stCoRoutine_t *lp = (stCoRoutine_t*)malloc( sizeof(stCoRoutine_t) );
	
	memset( lp,0,(long)(sizeof(stCoRoutine_t))); 


	lp->env = env;
	lp->pfn = pfn;
	lp->arg = arg;

	stStackMem_t* stack_mem = NULL;
	if( at.share_stack )
	{
		stack_mem = co_get_stackmem( at.share_stack);
		at.stack_size = at.share_stack->stack_size;
	}
	else
	{
		stack_mem = co_alloc_stackmem(at.stack_size);
	}
	lp->stack_mem = stack_mem;

	lp->ctx.ss_sp = stack_mem->stack_buffer;
	lp->ctx.ss_size = at.stack_size;

	lp->cStart = 0;
	lp->cEnd = 0;
	lp->cIsMain = 0;
	lp->cEnableSysHook = 0;
	lp->cIsShareStack = at.share_stack != NULL;

	lp->save_size = 0;
	lp->save_buffer = NULL;

	return lp;
}